

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O3

void __thiscall CP::queue<int>::back_to_front(queue<int> *this)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105198) = 0;
  if (this->mSize != 0) {
    sVar1 = this->mFront;
    iVar2 = (int)this->mSize + (int)sVar1 + -1;
    iVar3 = (int)this->mCap;
    if (iVar3 <= iVar2) {
      iVar2 = iVar2 % iVar3;
    }
    sVar4 = this->mCap;
    if (sVar1 != 0) {
      sVar4 = sVar1;
    }
    iVar2 = this->mData[iVar2];
    this->mFront = sVar4 - 1;
    this->mData[sVar4 - 1] = iVar2;
  }
  return;
}

Assistant:

void CP::queue<T>::back_to_front() {
    std::ios::sync_with_stdio(0);
    std::cin.tie(0);
    if (mSize == 0)
        return;
    T tmp = mData[fast_mod(mFront + mSize - 1, mCap)];
    mFront = mFront == 0 ? mCap - 1 : mFront - 1;
    mData[mFront] = tmp;
}